

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_query_feature(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char choice;
  wchar_t feature_class;
  wchar_t feata [1];
  wchar_t featr [1];
  wchar_t featp [1];
  wchar_t featg [1];
  wchar_t feath [1];
  wchar_t featc [1];
  wchar_t featz [1];
  wchar_t featu [1];
  wchar_t featb [1];
  wchar_t feato [1];
  wchar_t featf [1];
  wchar_t featq [2];
  wchar_t featm [2];
  wchar_t featt [2];
  wchar_t featd [4];
  wchar_t *local_70;
  undefined4 local_68;
  wchar_t local_60;
  wchar_t local_5c;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t local_10;
  wchar_t local_c;
  
  local_34 = FEAT_FLOOR;
  local_38 = FEAT_OPEN;
  local_3c = FEAT_BROKEN;
  local_40 = FEAT_LESS;
  local_44 = FEAT_MORE;
  local_20 = FEAT_LESS;
  local_1c = FEAT_MORE;
  local_48 = FEAT_CLOSED;
  local_18 = FEAT_CLOSED;
  local_14 = FEAT_OPEN;
  local_10 = FEAT_BROKEN;
  local_c = FEAT_SECRET;
  local_4c = FEAT_SECRET;
  local_28 = FEAT_MAGMA;
  local_24 = FEAT_MAGMA_K;
  local_30 = FEAT_QUARTZ;
  local_2c = FEAT_QUARTZ_K;
  local_50 = FEAT_GRANITE;
  local_54 = FEAT_PERM;
  local_58 = FEAT_RUBBLE;
  local_5c = FEAT_PASS_RUBBLE;
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_60);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Feature Query: ",(char *)&local_70);
    if (!_Var1) {
      return;
    }
    local_60 = (wchar_t)(char)local_70;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_60);
  }
  switch(local_60) {
  case L'a':
    local_70 = &local_5c;
    break;
  case L'b':
    local_70 = &local_3c;
    break;
  case L'c':
    local_70 = &local_48;
    break;
  case L'd':
    local_70 = &local_18;
    local_68 = 4;
    goto LAB_0013626c;
  default:
    msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
    return;
  case L'f':
    local_70 = &local_34;
    break;
  case L'g':
    local_70 = &local_50;
    break;
  case L'h':
    local_70 = &local_4c;
    break;
  case L'm':
    local_70 = &local_28;
    goto LAB_0013622b;
  case L'o':
    local_70 = &local_38;
    break;
  case L'p':
    local_70 = &local_54;
    break;
  case L'q':
    local_70 = &local_30;
    goto LAB_0013622b;
  case L'r':
    local_70 = &local_58;
    break;
  case L't':
    local_70 = &local_20;
LAB_0013622b:
    local_68 = 2;
    goto LAB_0013626c;
  case L'u':
    local_70 = &local_40;
    break;
  case L'z':
    local_70 = &local_44;
  }
  local_68 = 1;
LAB_0013626c:
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_feature,&local_70);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_feature(struct command *cmd)
{
	int feature_class;
	struct wiz_query_feature_closure selected;
	/* OMG hax */
	const int featf[] = { FEAT_FLOOR };
	const int feato[] = { FEAT_OPEN };
	const int featb[] = { FEAT_BROKEN };
	const int featu[] = { FEAT_LESS };
	const int featz[] = { FEAT_MORE };
	const int featt[] = { FEAT_LESS, FEAT_MORE };
	const int featc[] = { FEAT_CLOSED };
	const int featd[] = { FEAT_CLOSED, FEAT_OPEN, FEAT_BROKEN,
		FEAT_SECRET };
	const int feath[] = { FEAT_SECRET };
	const int featm[] = { FEAT_MAGMA, FEAT_MAGMA_K };
	const int featq[] = { FEAT_QUARTZ, FEAT_QUARTZ_K };
	const int featg[] = { FEAT_GRANITE };
	const int featp[] = { FEAT_PERM };
	const int featr[] = { FEAT_RUBBLE };
	const int feata[] = { FEAT_PASS_RUBBLE };

	if (cmd_get_arg_choice(cmd, "choice", &feature_class) != CMD_OK) {
		char choice;

		if (!get_com("Debug Command Feature Query: ", &choice)) return;
		feature_class = choice;
		cmd_set_arg_choice(cmd, "choice", feature_class);
	}

	switch (feature_class) {
		/* Floors */
		case 'f':
			selected.features = featf;
			selected.n = (int) N_ELEMENTS(featf);
			break;

		/* Open doors */
		case 'o':
			selected.features = feato;
			selected.n = (int) N_ELEMENTS(feato);
			break;

		/* Broken doors */
		case 'b':
			selected.features = featb;
			selected.n = (int) N_ELEMENTS(featb);
			break;

		/* Upstairs */
		case 'u':
			selected.features = featu;
			selected.n = (int) N_ELEMENTS(featu);
			break;

		/* Downstairs */
		case 'z':
			selected.features = featz;
			selected.n = (int) N_ELEMENTS(featz);
			break;

		/* Stairs */
		case 't':
			selected.features = featt;
			selected.n = (int) N_ELEMENTS(featt);
			break;

		/* Closed doors */
		case 'c':
			selected.features = featc;
			selected.n = (int) N_ELEMENTS(featc);
			break;

		/* Doors */
		case 'd':
			selected.features = featd;
			selected.n = (int) N_ELEMENTS(featd);
			break;

		/* Secret doors */
		case 'h':
			selected.features = feath;
			selected.n = (int) N_ELEMENTS(feath);
			break;

		/* Magma */
		case 'm':
			selected.features = featm;
			selected.n = (int) N_ELEMENTS(featm);
			break;

		/* Quartz */
		case 'q':
			selected.features = featq;
			selected.n = (int) N_ELEMENTS(featq);
			break;

		/* Granite */
		case 'g':
			selected.features = featg;
			selected.n = (int) N_ELEMENTS(featg);
			break;

		/* Permanent wall */
		case 'p':
			selected.features = featp;
			selected.n = (int) N_ELEMENTS(featp);
			break;

		/* Rubble */
		case 'r':
			selected.features = featr;
			selected.n = (int) N_ELEMENTS(featr);
			break;

		/* Passable rubble */
		case 'a':
			selected.features = feata;
			selected.n = (int) N_ELEMENTS(feata);
			break;

		/* Invalid entry */
		default:
			msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
			return;
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_feature, &selected);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}